

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wav_file.cc
# Opt level: O3

void __thiscall webrtc::WavReader::WavReader(WavReader *this,string *filename)

{
  bool bVar1;
  FILE *pFVar2;
  string *result;
  ostream *poVar3;
  int line;
  WavFormat format;
  size_t bytes_per_sample;
  ReadableWavFile readable;
  WavFormat local_19c;
  size_t local_198;
  ReadableWav local_190;
  FILE *local_188;
  FatalMessage local_180;
  
  (this->super_WavFile)._vptr_WavFile = (_func_int **)&PTR__WavReader_001d0e30;
  pFVar2 = fopen((filename->_M_dataplus)._M_p,"rb");
  this->file_handle_ = (FILE *)pFVar2;
  if (pFVar2 == (FILE *)0x0) {
    rtc::FatalMessage::FatalMessage
              (&local_180,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/wav_file.cc"
               ,0x33);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_180,"Check failed: file_handle_",0x1a);
    std::ios::widen((char)(ostream *)&local_180 + (char)*(undefined8 *)(local_180._0_8_ + -0x18));
    std::ostream::put((char)&local_180);
    poVar3 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"# ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"Could not open wav file for reading.",0x24);
LAB_0014dced:
    rtc::FatalMessage::~FatalMessage(&local_180);
  }
  local_190._vptr_ReadableWav = (_func_int **)&PTR_Read_001d0ee0;
  local_188 = pFVar2;
  bVar1 = ReadWavHeader(&local_190,&this->num_channels_,&this->sample_rate_,&local_19c,&local_198,
                        &this->num_samples_);
  if (!bVar1) {
    rtc::FatalMessage::FatalMessage
              (&local_180,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/wav_file.cc"
               ,0x39);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_180,
               "Check failed: ReadWavHeader(&readable, &num_channels_, &sample_rate_, &format, &bytes_per_sample, &num_samples_)"
               ,0x70);
    std::ios::widen((char)(ostream *)&local_180 + (char)*(undefined8 *)(local_180._0_8_ + -0x18));
    std::ostream::put((char)&local_180);
    poVar3 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"# ",2);
    goto LAB_0014dced;
  }
  this->num_samples_remaining_ = this->num_samples_;
  if (local_19c != kWavFormatPcm) {
    result = rtc::MakeCheckOpString<webrtc::WavFormat,webrtc::WavFormat>
                       (&kWavFormat,&local_19c,"kWavFormat == format");
    if (result != (string *)0x0) {
      line = 0x3b;
      goto LAB_0014dcdb;
    }
  }
  if (local_198 != 2) {
    result = rtc::MakeCheckOpString<unsigned_long,unsigned_long>
                       (&kBytesPerSample,&local_198,"kBytesPerSample == bytes_per_sample");
    if (result != (string *)0x0) {
      line = 0x3c;
LAB_0014dcdb:
      rtc::FatalMessage::FatalMessage
                (&local_180,
                 "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/wav_file.cc"
                 ,line,result);
      rtc::FatalMessage::~FatalMessage(&local_180);
    }
  }
  return;
}

Assistant:

WavReader::WavReader(const std::string& filename)
    : file_handle_(fopen(filename.c_str(), "rb")) {
  RTC_CHECK(file_handle_) << "Could not open wav file for reading.";

  ReadableWavFile readable(file_handle_);
  WavFormat format;
  size_t bytes_per_sample;
  RTC_CHECK(ReadWavHeader(&readable, &num_channels_, &sample_rate_, &format,
                          &bytes_per_sample, &num_samples_));
  num_samples_remaining_ = num_samples_;
  RTC_CHECK_EQ(kWavFormat, format);
  RTC_CHECK_EQ(kBytesPerSample, bytes_per_sample);
}